

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O2

void Ivy_ManTestCutsTravAll(Ivy_Man_t *p)

{
  abctime aVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *p_00;
  Vec_Int_t *vStore;
  int *piVar3;
  Vec_Vec_t *p_01;
  void **ppvVar4;
  Ivy_Obj_t *pObj;
  abctime aVar5;
  uint nNodeLimit;
  int i;
  Ivy_Man_t *p_02;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  aVar1 = Abc_Clock();
  pVVar2 = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  vStore = (Vec_Int_t *)malloc(0x10);
  vStore->nCap = 100;
  vStore->nSize = 0;
  piVar3 = (int *)malloc(400);
  vStore->pArray = piVar3;
  p_01 = (Vec_Vec_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  p_01->pArray = ppvVar4;
  uVar7 = -(p->nObjs[5] + p->nObjs[6]);
  uVar8 = 0;
  uVar6 = 0;
  for (iVar9 = 0; p_02 = (Ivy_Man_t *)p->vObjs, iVar9 < *(int *)((long)&p_02->vPis + 4);
      iVar9 = iVar9 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)p_02,iVar9);
    if ((pObj != (Ivy_Obj_t *)0x0) &&
       (nNodeLimit = (*(uint *)&pObj->field_0x8 & 0xf) - 7, 0xfffffffd < nNodeLimit)) {
      Ivy_NodeFindCutsTravAll(p_02,pObj,4,nNodeLimit,pVVar2,p_00,vStore,p_01);
      uVar7 = uVar7 + Ivy_NodeFindCutsTravAll::CutStore.nCuts;
      uVar6 = uVar6 + (Ivy_NodeFindCutsTravAll::CutStore.nCuts == 0x100);
      uVar8 = uVar8 + 1;
    }
  }
  iVar9 = 0x7c733a;
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)uVar7,
         (ulong)(uint)(p->nObjs[5] + p->nObjs[1] + p->nObjs[6]),(ulong)uVar8,(ulong)uVar6);
  Abc_Print(iVar9,"%s =","Time");
  aVar5 = Abc_Clock();
  Abc_Print(iVar9,"%9.2f sec\n",(double)(aVar5 - aVar1) / 1000000.0);
  Vec_PtrFree(pVVar2);
  Vec_PtrFree(p_00);
  free(vStore->pArray);
  free(vStore);
  iVar9 = p_01->nSize;
  i = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
    i = 0;
  }
  for (; iVar9 != i; i = i + 1) {
    pVVar2 = Vec_VecEntry(p_01,i);
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(pVVar2);
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p_01);
  return;
}

Assistant:

void Ivy_ManTestCutsTravAll( Ivy_Man_t * p )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    Vec_Ptr_t * vNodes, * vFront;
    Vec_Int_t * vStore;
    Vec_Vec_t * vBitCuts;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();

    vNodes = Vec_PtrAlloc( 100 );
    vFront = Vec_PtrAlloc( 100 );
    vStore = Vec_IntAlloc( 100 );
    vBitCuts = Vec_VecAlloc( 100 );

    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_NodeFindCutsTravAll( p, pObj, 4, 60, vNodes, vFront, vStore, vBitCuts );
        nCutsCut    = pStore->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );

    Vec_PtrFree( vNodes );
    Vec_PtrFree( vFront );
    Vec_IntFree( vStore );
    Vec_VecFree( vBitCuts );

}